

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_log.cc
# Opt level: O0

bool __thiscall BuildLog::WriteEntry(BuildLog *this,FILE *f,LogEntry *entry)

{
  uint uVar1;
  uint uVar2;
  TimeStamp TVar3;
  int iVar4;
  undefined8 uVar5;
  LogEntry *entry_local;
  FILE *f_local;
  BuildLog *this_local;
  
  uVar1 = entry->start_time;
  uVar2 = entry->end_time;
  TVar3 = entry->mtime;
  uVar5 = std::__cxx11::string::c_str();
  iVar4 = fprintf((FILE *)f,"%d\t%d\t%ld\t%s\t%lx\n",(ulong)uVar1,(ulong)uVar2,TVar3,uVar5,
                  entry->command_hash);
  return 0 < iVar4;
}

Assistant:

bool BuildLog::WriteEntry(FILE* f, const LogEntry& entry) {
  return fprintf(f, "%d\t%d\t%" PRId64 "\t%s\t%" PRIx64 "\n",
          entry.start_time, entry.end_time, entry.mtime,
          entry.output.c_str(), entry.command_hash) > 0;
}